

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portmidi.c
# Opt level: O2

uint32_t pm_read_bytes(PmInternal *midi,uchar *data,int len,PmTimestamp timestamp)

{
  int iVar1;
  byte bVar2;
  uint in_EAX;
  PmError PVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  uint32_t uVar7;
  ulong uVar8;
  PmEvent event;
  PmEvent local_38;
  
  local_38.timestamp = timestamp;
  if (midi == (PmInternal *)0x0) {
    __assert_fail("midi",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jwinarske[P]portmidi/pm_common/portmidi.c"
                  ,0x425,
                  "uint32_t pm_read_bytes(PmInternal *, const unsigned char *, int, PmTimestamp)");
  }
  if (len == 0) {
    return 0;
  }
  uVar8 = 0;
  local_38.message = in_EAX;
  if (midi->sysex_in_progress == 0) {
    uVar4 = 0;
    uVar8 = 0;
    if (0 < len) {
      uVar8 = (ulong)(uint)len;
    }
    for (; uVar8 != uVar4; uVar4 = uVar4 + 1) {
      bVar2 = data[uVar4];
      if (bVar2 == 0xf0) {
        if ((midi->filters & 1) == 0) {
          midi->sysex_in_progress = 1;
          uVar8 = uVar4 & 0xffffffff;
          break;
        }
LAB_00103c5c:
        local_38.message = (PmMessage)bVar2;
        pm_read_short(midi,&local_38);
      }
      else {
        if (bVar2 == 0xf7) {
          midi->sysex_in_progress = 0;
          return (int)uVar4 + 1;
        }
        if ((char)bVar2 < '\0') goto LAB_00103c5c;
      }
    }
  }
LAB_00103b69:
  do {
    while( true ) {
      uVar7 = (uint32_t)uVar8;
      if (len <= (int)uVar7) {
        return uVar7;
      }
      if (midi->sysex_in_progress == 0) {
        return uVar7;
      }
      iVar5 = midi->sysex_message_count;
      uVar4 = (ulong)(int)uVar7;
      if (((iVar5 != 0) || (len + -4 < (int)uVar7)) ||
         (local_38.message = *(PmMessage *)(data + uVar4), (local_38.message & 0x80808080U) != 0))
      break;
      PVar3 = Pm_Enqueue(midi->queue,&local_38);
      if (PVar3 == pmBufferOverflow) {
        midi->sysex_in_progress = 0;
      }
      uVar8 = (ulong)(uVar7 + 4);
    }
    do {
      do {
        uVar8 = uVar4;
        if ((long)len <= (long)uVar8) goto LAB_00103b69;
        uVar6 = (uint)data[uVar8];
      } while (((~uVar6 & 0xf8) == 0) &&
              (uVar4 = uVar8 + 1, ((uint)midi->filters >> (data[uVar8] & 0xf) & 1) != 0));
      iVar1 = iVar5 + 1;
      midi->sysex_message_count = iVar1;
      midi->sysex_message = midi->sysex_message | uVar6 << ((byte)(iVar5 << 3) & 0x1f);
      if (uVar6 == 0xf7) {
        midi->sysex_in_progress = 0;
        pm_flush_sysex(midi,local_38.timestamp);
        return (int)uVar8 + 1;
      }
      uVar4 = uVar8 + 1;
      iVar5 = iVar1;
    } while (iVar1 != 4);
    uVar8 = (ulong)((int)uVar8 + 1);
    pm_flush_sysex(midi,local_38.timestamp);
  } while( true );
}

Assistant:

unsigned int pm_read_bytes(PmInternal *midi, const unsigned char *data, 
                    int len, PmTimestamp timestamp)
{
    int i = 0; /* index into data, must not be unsigned (!) */
    PmEvent event;
    event.timestamp = timestamp;
    assert(midi);
    /* note that since buffers may not have multiples of 4 bytes,
     * pm_read_bytes may be called in the middle of an outgoing
     * 4-byte PortMidi message. sysex_in_progress indicates that
     * a sysex has been sent but no eox.
     */
    if (len == 0) return 0; /* sanity check */
    if (!midi->sysex_in_progress) {
        while (i < len) { /* process all data */
            unsigned char byte = data[i++];
            if (byte == MIDI_SYSEX &&
                !pm_realtime_filtered(byte, midi->filters)) {
                midi->sysex_in_progress = TRUE;
                i--; /* back up so code below will get SYSEX byte */
                break; /* continue looping below to process msg */
            } else if (byte == MIDI_EOX) {
                midi->sysex_in_progress = FALSE;
                return i; /* done with one message */
            } else if (byte & MIDI_STATUS_MASK) {
                /* We're getting MIDI but no sysex in progress.
                 * Either the SYSEX status byte was dropped or
                 * the message was filtered. Drop the data, but
                 * send any embedded realtime bytes.
                 */
                /* assume that this is a real-time message:
                 * it is an error to pass non-real-time messages
                 * to pm_read_bytes
                 */
                event.message = byte;
                pm_read_short(midi, &event);
            }
        } /* all bytes in the buffer are processed */
    }
    /* Now, i<len implies sysex_in_progress. If sysex_in_progress
     * becomes false in the loop, there must have been an overflow
     * and we can just drop all remaining bytes 
     */
    while (i < len && midi->sysex_in_progress) {
        if (midi->sysex_message_count == 0 && i <= len - 4 &&
            ((event.message = (((PmMessage) data[i]) | 
                             (((PmMessage) data[i+1]) << 8) |
                             (((PmMessage) data[i+2]) << 16) |
                             (((PmMessage) data[i+3]) << 24))) &
             0x80808080) == 0) { /* all data, no status */ 
            if (Pm_Enqueue(midi->queue, &event) == pmBufferOverflow) {
                midi->sysex_in_progress = FALSE;
            }
            i += 4;
        } else {
            while (i < len) {
                /* send one byte at a time */
                unsigned char byte = data[i++];
                if (is_real_time(byte) && 
                    pm_realtime_filtered(byte, midi->filters)) {
                    continue; /* real-time data is filtered, so omit */
                }
                midi->sysex_message |= 
                    (byte << (8 * midi->sysex_message_count++));
                if (byte == MIDI_EOX) {
                    midi->sysex_in_progress = FALSE;
                    pm_flush_sysex(midi, event.timestamp);
                    return i;
                } else if (midi->sysex_message_count == 4) {
                    pm_flush_sysex(midi, event.timestamp);
                    /* after handling at least one non-data byte
                     * and reaching a 4-byte message boundary,
                     * resume trying to send 4 at a time in outer loop
                     */
                    break;
                }
            }
        }
    }
    return i;
}